

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall
Context<true>::PushNamespace(Context<true> *this,char *ns,BaseState<true> *return_state)

{
  undefined8 in_RDX;
  vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *in_RSI;
  long in_RDI;
  Namespace<true> n;
  value_type *__x;
  string *in_stack_ffffffffffffff88;
  vw *in_stack_ffffffffffffff90;
  string local_68 [32];
  char local_48;
  uint64_t local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *local_20;
  undefined8 local_18;
  vector<Namespace<true>,_std::allocator<Namespace<true>_>_> *local_10;
  
  local_48 = *(char *)&(in_RSI->
                       super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
  __x = *(value_type **)(in_RDI + 8);
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(char *)in_RSI,(allocator *)&stack0xffffffffffffff97);
  local_40 = VW::hash_space(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  local_38 = *(long *)(in_RDI + 0x50) + 0x20 +
             (long)(int)*(char *)&(local_10->
                                  super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start * 0x68;
  local_30 = 0;
  local_28 = local_18;
  local_20 = local_10;
  std::vector<Namespace<true>,_std::allocator<Namespace<true>_>_>::push_back(in_RSI,__x);
  return;
}

Assistant:

void PushNamespace(const char* ns, BaseState<audit>* return_state)
  {
    Namespace<audit> n;
    n.feature_group = ns[0];
    n.namespace_hash = VW::hash_space(*all, ns);
    n.ftrs = ex->feature_space + ns[0];
    n.feature_count = 0;
    n.return_state = return_state;

    n.name = ns;

    namespace_path.push_back(n);
  }